

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

void __thiscall String::String(String *this,Type *on)

{
  ulong uVar1;
  char *__end;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  *(undefined ***)this = &PTR__Container_0010eb60;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/std/string","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/std/string","");
  uVar1 = (**(code **)(*(long *)this + 0xc0))(this);
  Typelib::Container::Container
            (&this->super_Container,(string *)local_70,(string *)local_50,uVar1,on);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  *(undefined ***)this = &PTR__Container_0010eb60;
  return;
}

Assistant:

String::String(Type const& on)
    : Container("/std/string", "/std/string", getNaturalSize(), on) {
}